

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline.cpp
# Opt level: O0

CollisionType __thiscall
Pipeline::hitCollidable
          (Pipeline *this,TransformationData *pipelineData,Transformation *transformation)

{
  vector<Collidable_*,_std::allocator<Collidable_*>_> *this_00;
  Collidable *pCVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  reference ppCVar6;
  vector<Quad_*,_std::allocator<Quad_*>_> *pvVar7;
  Vec2d *pVVar8;
  Translation *tl;
  Collidable *collidable;
  iterator __end1;
  iterator __begin1;
  vector<Collidable_*,_std::allocator<Collidable_*>_> *__range1;
  Collidable *collider;
  CollisionType type;
  bool collided;
  Transformation *transformation_local;
  TransformationData *pipelineData_local;
  Pipeline *this_local;
  
  bVar3 = false;
  collider._0_4_ = NONE;
  this_00 = this->collidables;
  __end1 = std::vector<Collidable_*,_std::allocator<Collidable_*>_>::begin(this_00);
  collidable = (Collidable *)std::vector<Collidable_*,_std::allocator<Collidable_*>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Collidable_**,_std::vector<Collidable_*,_std::allocator<Collidable_*>_>_>
                                     *)&collidable), bVar2) {
    ppCVar6 = __gnu_cxx::
              __normal_iterator<Collidable_**,_std::vector<Collidable_*,_std::allocator<Collidable_*>_>_>
              ::operator*(&__end1);
    pCVar1 = *ppCVar6;
    pvVar7 = TransformationData::getWorkingQuads(pipelineData);
    pVVar8 = TransformationData::getWorkingOffset(pipelineData);
    uVar4 = (*pCVar1->_vptr_Collidable[1])(pCVar1,pvVar7,pVVar8);
    if ((uVar4 & 1) != 0) {
      bVar3 = true;
      collider._0_4_ = RESTRICT;
    }
    __gnu_cxx::
    __normal_iterator<Collidable_**,_std::vector<Collidable_*,_std::allocator<Collidable_*>_>_>::
    operator++(&__end1);
  }
  if ((bVar3) && (iVar5 = (*transformation->_vptr_Transformation[2])(), iVar5 == 1)) {
    pVVar8 = Translation::getTranslationVector((Translation *)transformation);
    bVar3 = Vec2d::equals(pVVar8,Vec2d::SOUTH);
    if (bVar3) {
      collider._0_4_ = HALT;
    }
  }
  return (CollisionType)collider;
}

Assistant:

Collidable::CollisionType Pipeline::hitCollidable(TransformationData& pipelineData, Transformation* transformation) {
    bool collided = false;
    Collidable::CollisionType type = Collidable::NONE;
    Collidable* collider = nullptr;
    for (auto collidable : *collidables) {
        if (collidable->collidesWithQuads(pipelineData.getWorkingQuads(), pipelineData.getWorkingOffset())) {
            collider = collidable;
            collided = true;
            type = Collidable::CollisionType::RESTRICT;
        }
    }
    
    if (collided && transformation->getTransformationType() == TransformationType::TRANSLATION) {
        Translation* tl = static_cast<Translation*>(transformation);
        if (tl->getTranslationVector()->equals(Vec2d::SOUTH)) {
            type = Collidable::CollisionType::HALT;
        }
    }
    
    return type;
}